

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastEndGroupImpl<unsigned_char>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  anon_class_24_3_6b4a22af f_01;
  anon_class_24_3_6b4a22af f_02;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  FieldEntry *pFVar11;
  char *pcVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 in_RAX;
  undefined7 extraout_var;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_01;
  long lVar13;
  RepeatedField<unsigned_long> *this;
  ushort *puVar14;
  RepeatedField<unsigned_int> *this_00;
  Nonnull<const_char_*> pcVar15;
  undefined7 extraout_var_00;
  string *psVar16;
  undefined7 extraout_var_01;
  MessageLite *pMVar17;
  char *pcVar18;
  TcParseTableBase *pTVar19;
  void *pvVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  ParseContext *ctx_00;
  uint *puVar22;
  ulong uVar23;
  int *failure_msg;
  uint uVar24;
  code *UNRECOVERED_JUMPTABLE_00;
  TcFieldData TVar25;
  code *arena;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar26;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  FieldEntry *extraout_RDX_01;
  FieldEntry *entry;
  undefined8 extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *extraout_RDX_04;
  ParseContext *extraout_RDX_05;
  ParseContext *extraout_RDX_06;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  ParseContext *extraout_RDX_09;
  ParseContext *extraout_RDX_10;
  ParseContext *extraout_RDX_11;
  ParseContext *extraout_RDX_12;
  ParseContext *extraout_RDX_13;
  long *plVar27;
  undefined8 extraout_RDX_14;
  ParseContext *extraout_RDX_15;
  ParseContext *extraout_RDX_16;
  ParseContext *pPVar28;
  ParseContext *extraout_RDX_17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar29;
  ParseContext *extraout_RDX_18;
  ushort uVar30;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar31;
  undefined4 *puVar32;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar33;
  uint uVar34;
  uint7 uVar36;
  uint64_t *puVar35;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar37;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ptr_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar38;
  Arena *pAVar39;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar40;
  undefined8 *puVar41;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar42;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar43;
  uint16_t uVar44;
  uint uVar45;
  ushort uVar46;
  int iVar47;
  FieldEntry *pFVar48;
  long lVar49;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar50;
  undefined4 uVar51;
  bool bVar52;
  bool bVar53;
  string_view sVar54;
  pair<const_char_*,_int> pVar55;
  pair<const_char_*,_int> pVar56;
  string_view sVar57;
  pair<const_char_*,_int> pVar58;
  pair<const_char_*,_int> pVar59;
  string_view data_00;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  byte bStack_a9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_88;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_80;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_78;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_70;
  undefined1 auStack_68 [8];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_38;
  
  uVar10 = (uint)hasbits;
  if (data.field_0._0_1_ == '\0') {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (data.field_0._2_4_ & 0xffff) - 1;
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        AlignFail();
      }
      *puVar22 = *puVar22 | uVar10;
    }
    return ptr + 1;
  }
  bVar1 = *ptr;
  uVar34 = (uint)bVar1;
  aVar29.data = (long)ptr + 1U;
  if ((char)bVar1 < '\0') {
    uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
    cVar2 = *(char *)((long)ptr + 1U);
    lVar13 = CONCAT71(uVar36,cVar2);
    if (cVar2 < '\0') {
      uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
      lVar13 = CONCAT71(uVar36,ptr[2]);
      if (ptr[2] < '\0') {
        uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
        lVar13 = CONCAT71(uVar36,ptr[3]);
        if (ptr[3] < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            uVar34 = 0;
            aVar29.data = 0;
          }
          else {
            uVar34 = (int)CONCAT71(uVar36,ptr[4]) << 0x1c | (uint)(uVar36 >> 0x1c);
            ptr = (char *)((long)ptr + 5);
            aVar29.data = (uint64_t)ptr;
          }
        }
        else {
          uVar34 = (int)lVar13 << 0x15 | (uint)(uVar36 >> 0x23);
          ptr = (char *)((long)ptr + 4);
          aVar29.data = (uint64_t)ptr;
        }
      }
      else {
        uVar34 = (int)lVar13 << 0xe | (uint)(uVar36 >> 0x2a);
        ptr = (char *)((long)ptr + 3);
        aVar29.data = (uint64_t)ptr;
      }
    }
    else {
      uVar34 = (int)lVar13 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
      ptr = (char *)((long)ptr + 2);
      aVar29.data = (uint64_t)ptr;
    }
  }
  if ((EpsCopyInputStream *)aVar29.data == (EpsCopyInputStream *)0x0) {
    pcVar12 = Error(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  aStack_40.data = 0x2c131f;
  aStack_38 = in_RAX;
  pFVar11 = FindFieldEntry(table,uVar34 >> 3);
  if (pFVar11 == (FieldEntry *)0x0) {
    TVar25.field_0.data._4_4_ = 0;
    TVar25.field_0.data._0_4_ = uVar34;
    pcVar12 = (*table->fallback)(msg,(char *)aVar29,ctx,TVar25,table,hasbits);
    return pcVar12;
  }
  aVar37._0_4_ = (int)pFVar11 - (int)table;
  UNRECOVERED_JUMPTABLE_00._4_4_ = aVar37._0_4_;
  UNRECOVERED_JUMPTABLE_00._0_4_ = uVar34;
  aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
  switch(pFVar11->type_card & 0xf) {
  case 0:
    pcVar12 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                                 hasbits);
    return pcVar12;
  case 1:
    pFVar11 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    if (((ulong)pFVar11 & 3) != 0) {
      aStack_80.data = 0x2cdd90;
      AlignFail(pFVar11);
    }
    uVar46 = pFVar11->type_card;
    uVar10 = uVar46 & 0x30;
    if (uVar10 == 0x20) {
      pcVar12 = MpRepeatedVarint<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if ((uVar34 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_002cdb11;
    }
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar29;
    pPVar28 = ctx;
    if ((long)aVar43.data < 0) {
      ptr_00.data = 0xffffffffffffff80;
      aVar40.data = (long)*(char *)(aVar29.data + 1) << 7 | 0x7f;
      if ((long)aVar40 < 0) {
        pPVar28 = (ParseContext *)((long)*(char *)(aVar29.data + 2) << 0xe | 0x3fff);
        if ((long)pPVar28 < 0) {
          aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar40 < 0) {
            pPVar28 = (ParseContext *)
                      ((ulong)pPVar28 & ((long)*(char *)(aVar29.data + 4) << 0x1c | 0xfffffffU));
            if ((long)pPVar28 < 0) {
              aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar40 < 0) {
                pPVar28 = (ParseContext *)
                          ((ulong)pPVar28 &
                          ((long)*(char *)(aVar29.data + 6) << 0x2a | 0x3ffffffffffU));
                if ((long)pPVar28 < 0) {
                  aVar40.data = aVar40.data &
                                ((long)*(char *)(aVar29.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar40 < 0) {
                    pPVar28 = (ParseContext *)
                              ((ulong)pPVar28 &
                              ((ulong)*(byte *)(aVar29.data + 8) << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar28 < 0) {
                      aVar50.data = aVar29.data + 10;
                      if (*(char *)(aVar29.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar29.data + 9);
                        ptr_00.data._1_7_ = 0xffffffffffffff;
                        ptr_00.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aVar50.data = 0;
                          goto LAB_002cdb35;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar28 = (ParseContext *)((ulong)pPVar28 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      aVar50.data = aVar29.data + 9;
                    }
                  }
                  else {
                    aVar50.data = aVar29.data + 8;
                  }
                }
                else {
                  aVar50.data = aVar29.data + 7;
                }
              }
              else {
                aVar50.data = aVar29.data + 6;
              }
            }
            else {
              aVar50.data = aVar29.data + 5;
            }
          }
          else {
            aVar50.data = aVar29.data + 4;
          }
        }
        else {
          aVar50.data = aVar29.data + 3;
        }
        aVar40.data = aVar40.data & (ulong)pPVar28;
      }
      else {
        aVar50.data = aVar29.data + 2;
      }
      aVar43.data = aVar43.data & aVar40.data;
    }
    else {
      aVar50.data = aVar29.data + 1;
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      ptr_00 = aVar29;
    }
LAB_002cdb35:
    if ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0) {
      pcVar12 = Error(msg,(char *)ptr_00,pPVar28,(TcFieldData)aVar40,table,hasbits);
      return pcVar12;
    }
    uVar24 = uVar46 & 0x600;
    pPVar28 = (ParseContext *)(ulong)uVar24;
    aVar37._0_4_ = uVar46 & 0x1c0;
    aVar37.data._4_4_ = 0;
    uVar45 = (uint)aVar43.data;
    aVar40 = aVar37;
    if ((EpsCopyInputStream *)aVar37.data == (EpsCopyInputStream *)0xc0) {
      if (uVar24 == 0x200) {
        aVar43.data = -(ulong)(uVar45 & 1) ^ aVar43.data >> 1;
      }
    }
    else if (aVar37._0_4_ == 0x80) {
      if ((uVar46 >> 10 & 1) == 0) {
        if (uVar24 == 0x200) {
          aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   (long)(int)(-(uVar45 & 1) ^ (uint)(aVar43.data >> 1) & 0x7fffffff);
        }
      }
      else {
        aStack_70.data = (ulong)CONCAT24(uVar46,aStack_70._0_4_) & 0x1c0ffffffff;
        puVar6 = *(uint32_t **)
                  ((long)&table->has_bits_offset +
                  (ulong)pFVar11->aux_idx * 8 + (ulong)table->aux_offset);
        aStack_58 = aVar37;
        if (uVar24 == 0x600) {
          bVar52 = (int)puVar6 <= (int)uVar45;
          pPVar28 = (ParseContext *)(ulong)CONCAT31(6,bVar52);
          bVar52 = (int)uVar45 <= (int)((ulong)puVar6 >> 0x20) && bVar52;
        }
        else {
          aStack_80.data = 0x2cdc19;
          auStack_68 = (undefined1  [8])hasbits;
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
          aStack_50 = aVar50;
          aStack_48 = aVar43;
          bVar52 = ValidateEnum(uVar45,puVar6);
          ctx = (ParseContext *)aStack_60;
          hasbits = (uint64_t)auStack_68;
          aVar43 = aStack_48;
          aVar50 = aStack_50;
        }
        aVar37._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
        aVar40 = aStack_58;
        if (bVar52 == false) {
          pcVar12 = MpUnknownEnumFallback
                              (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                               hasbits);
          return pcVar12;
        }
      }
    }
    aVar29 = aVar50;
    if (uVar10 == 0x30) {
      aStack_70.data._4_4_ = aVar37._0_4_;
      aStack_80.data = 0x2cdc96;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_58 = aVar40;
      ChangeOneof(table,pFVar11,uVar34 >> 3,pPVar28,msg);
      aVar37._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
      aVar40 = aStack_58;
      ctx = (ParseContext *)aStack_60;
    }
    else if (uVar10 == 0x10) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar11->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) goto LAB_002cdde8;
      *puVar22 = *puVar22 | 1 << ((byte)pFVar11->has_idx & 0x1f);
    }
    if (aVar37._0_4_ == 0xc0) {
      paVar31 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)&msg->_vptr_MessageLite + (ulong)pFVar11->offset);
      if (((ulong)paVar31 & 7) != 0) {
        aStack_80.data = 0x2cddf2;
        AlignFail();
      }
      paVar31->data = (uint64_t)aVar43;
    }
    else if (aVar37._0_4_ == 0x80) {
      puVar32 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar11->offset);
      if (((ulong)puVar32 & 3) != 0) {
LAB_002cdde8:
        aStack_80.data = 0x2cdded;
        AlignFail();
      }
      *puVar32 = (int)aVar43.data;
    }
    else {
      if (aVar37._0_4_ == 0) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x2cde19;
        auStack_68 = (undefined1  [8])hasbits;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aVar40.data,0,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        hasbits = (uint64_t)auStack_68;
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x2cded8;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar15);
        aStack_80.data = 0x2cdee0;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)pFVar11->offset) =
           (EpsCopyInputStream *)aVar43.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_80.data = 0x2cddfa;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)hasbits;
      }
      return (char *)aVar29.data;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar10 & 7) != 0) {
      aStack_80.data = 0x2cde44;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
LAB_002cdb11:
    pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 2:
    uVar23 = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
    if ((uVar23 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce0ec;
      AlignFail();
    }
    if ((uVar34 & 7) != 2) {
      pcVar12 = MpRepeatedVarint<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar46 = *(ushort *)(uVar23 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce0f4;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | uVar10;
    }
    uVar30 = uVar46 >> 6;
    uVar8 = uVar30 & 7;
    if ((uVar30 & 7) == 0) {
      pcVar12 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar10 = uVar46 & 0x600;
    if (uVar8 == 2) {
      switch(uVar10) {
      default:
        pcVar12 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      case 0x200:
      case 0x220:
      case 0x240:
      case 0x260:
      case 0x280:
      case 0x2a0:
      case 0x2c0:
      case 0x2e0:
      case 0x300:
      case 800:
      case 0x340:
      case 0x360:
      case 0x380:
      case 0x3a0:
      case 0x3c0:
      case 0x3e0:
        pcVar12 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      case 0x400:
      case 0x420:
      case 0x440:
      case 0x460:
      case 0x480:
      case 0x4a0:
      case 0x4c0:
      case 0x4e0:
      case 0x500:
      case 0x520:
      case 0x540:
      case 0x560:
      case 0x580:
      case 0x5a0:
      case 0x5c0:
      case 0x5e0:
        pcVar12 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      case 0x600:
      case 0x620:
      case 0x640:
      case 0x660:
      case 0x680:
      case 0x6a0:
      case 0x6c0:
      case 0x6e0:
      case 0x700:
      case 0x720:
      case 0x740:
      case 0x760:
      case 0x780:
      case 0x7a0:
      case 0x7c0:
      case 0x7e0:
        pcVar12 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      }
    }
    if (uVar8 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce11b;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    if ((short)uVar10 == 0) {
      pcVar12 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if (uVar10 == 0x200) {
      pcVar15 = (Nonnull<const_char_*>)0x0;
    }
    else {
      aStack_50.data = 0x2ce105;
      pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar10,0x200,"xform_val == +field_layout::kTvZigZag");
    }
    if (pcVar15 != (Nonnull<const_char_*>)0x0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce137;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&aStack_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar15);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_002ce13f;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&aStack_40);
    }
    pcVar12 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 3:
    pFVar11 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    if (((ulong)pFVar11 & 3) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce2e5;
      AlignFail(pFVar11);
    }
    uVar46 = pFVar11->type_card & 0x30;
    if (uVar46 == 0x20) {
      pcVar12 = MpRepeatedFixed<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar10 = pFVar11->type_card & 0x1c0;
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar10 == 0xc0) {
      if ((uVar34 & 7) != 1) {
LAB_002ce203:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_002ce2a3;
      }
    }
    else {
      if (uVar10 == 0x80) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x2ce30d;
        aStack_60 = aVar29;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48.data = hasbits;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar10,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar29 = aStack_60;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_48.data;
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce354;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar15);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce35c;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar34 & 7) != 5) goto LAB_002ce203;
    }
    if (uVar46 == 0x30) {
      aStack_70.data = 0x2ce230;
      aStack_60 = aVar29;
      ChangeOneof(table,pFVar11,uVar34 >> 3,(ParseContext *)aVar43,msg);
      aVar29 = aStack_60;
    }
    else if (uVar46 == 0x10) {
      puVar22 = (uint *)((long)msg + (ulong)((uint)pFVar11->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) goto LAB_002ce326;
      *puVar22 = *puVar22 | 1 << ((byte)pFVar11->has_idx & 0x1f);
    }
    puVar41 = (undefined8 *)((ulong)pFVar11->offset + (long)msg);
    if (uVar10 == 0xc0) {
      if (((ulong)puVar41 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce330;
        AlignFail();
      }
      *puVar41 = *(undefined8 *)aVar29;
      lVar13 = 8;
    }
    else {
      if (((ulong)puVar41 & 3) != 0) {
LAB_002ce326:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce32b;
        AlignFail();
      }
      *(undefined4 *)puVar41 = *(undefined4 *)aVar29;
      lVar13 = 4;
    }
    aVar29.data = aVar29.data + lVar13;
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2ce338;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)hasbits;
      }
      return (char *)aVar29.data;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar10 & 7) != 0) {
      aStack_70.data = (uint64_t)MpPackedFixed<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
LAB_002ce2a3:
    pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 4:
    puVar22 = (uint *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    if (((ulong)puVar22 & 3) != 0) {
      aStack_60.data = 0x2ce4d6;
      AlignFail(puVar22);
    }
    if ((uVar34 & 7) != 2) {
      pcVar12 = MpRepeatedFixed<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar46 = *(ushort *)((long)puVar22 + 10);
    bVar1 = *(byte *)aVar29;
    uVar10 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60.data = 0x2ce3ec;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
      pVar58 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      pcVar12 = pVar58.first;
      uVar10 = pVar58.second;
    }
    else {
      pcVar12 = (char *)(aVar29.data + 1);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
    }
    aVar29 = aStack_50;
    uVar34 = uVar46 & 0x1c0;
    if ((ulong)uVar34 == 0xc0) {
      aVar43.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar22;
      if ((aVar43.data & 7) != 0) {
LAB_002ce4d6:
        aStack_60.data = 0x2ce4de;
        AlignFail(aVar43.data);
      }
      aStack_60.data = 0x2ce422;
      puVar14 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          (&ctx->super_EpsCopyInputStream,pcVar12,uVar10,
                           (RepeatedField<unsigned_long> *)aVar43);
      pPVar28 = extraout_RDX;
    }
    else {
      if (uVar34 == 0x80) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60.data = 0x2ce50b;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar34,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      }
      aVar29 = aStack_50;
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_60.data = 0x2ce534;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar15);
        aStack_60.data = 0x2ce53c;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      aVar43.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar22;
      if ((aVar43.data & 7) != 0) goto LAB_002ce4d6;
      aStack_60.data = 0x2ce45d;
      puVar14 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          (&ctx->super_EpsCopyInputStream,pcVar12,uVar10,
                           (RepeatedField<unsigned_int> *)aVar43);
      pPVar28 = extraout_RDX_00;
    }
    if (puVar14 == (ushort *)0x0) {
      pcVar12 = Error((MessageLite *)aVar29,pcVar12,pPVar28,(TcFieldData)aVar43,table,aStack_48.data
                     );
      return pcVar12;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar14) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&((MessageLite *)aVar29.data)->_vptr_MessageLite +
                          (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60.data = 0x2ce518;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_48.data;
      }
      return (char *)puVar14;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*puVar14;
    if ((uVar10 & 7) != 0) {
      aStack_60.data = (uint64_t)MpString<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                (aVar29.data,puVar14,ctx,
                                 (ulong)*puVar14 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                 table);
    return pcVar12;
  case 6:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    pFVar11 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) {
LAB_002cecb9:
      aStack_60.data = 0x2cecbe;
      AlignFail(pFVar11);
    }
    uVar46 = pFVar48->type_card;
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      if ((uVar46 & 0x1c0) == 0x40) {
        pcVar12 = MpRepeatedMessageOrGroup<false,true>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      }
      if ((uVar46 & 0x1c0) == 0) {
        pcVar12 = MpRepeatedMessageOrGroup<false,false>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      }
LAB_002cea7f:
      pcVar12 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar12;
    }
    aVar37._0_4_ = uVar34 & 7;
    if ((uVar46 & 0x1c0) == 0x40) {
      if (aVar37._0_4_ != 3) goto LAB_002cea7f;
    }
    else if (((uVar46 & 0x1c0) != 0) || (aVar37._0_4_ != 2)) goto LAB_002cea7f;
    if (uVar30 == 0x30) {
      aStack_60.data = 0x2ceac0;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aStack_48 = aVar29;
      bVar52 = ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)(ulong)aVar37._0_4_,msg);
      uVar23 = CONCAT71(extraout_var,bVar52);
      UNRECOVERED_JUMPTABLE_00 = (code *)aStack_50;
      aVar29 = aStack_48;
    }
    else {
      if (uVar30 == 0x10) {
        pFVar11 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar11 & 3) != 0) goto LAB_002cecb9;
        pFVar11->offset = pFVar11->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
      }
      uVar23 = 0;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar11 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar11 & 3) != 0) goto LAB_002cecb9;
      pFVar11->offset = pFVar11->offset | uVar10;
    }
    plVar27 = (long *)((long)&msg->_vptr_MessageLite + (ulong)pFVar48->offset);
    if (((ulong)plVar27 & 7) != 0) {
      aStack_60.data = 0x2cecc6;
      AlignFail(plVar27);
    }
    pTVar19 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar48->aux_idx * 8 + (ulong)table->aux_offset);
    aVar21._0_4_ = uVar46 >> 9 & 3;
    aVar21.data._4_4_ = 0;
    if ((short)aVar21._0_4_ != 2) {
      aStack_50.data._0_4_ = (int)uVar23;
      aStack_48 = aVar29;
      if ((uVar46 >> 9 & 3) == 0) {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar12 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar9 = 0x9c8;
        goto LAB_002ced28;
      }
      if (aVar21._0_4_ != 1) {
        pTVar19 = *(TcParseTableBase **)pTVar19;
      }
      aStack_60.data = 0x2cece9;
      pTVar19 = MessageLite::GetTcParseTable((MessageLite *)pTVar19);
      uVar23 = aStack_50.data & 0xffffffff;
      aVar29 = aStack_48;
    }
    if ((byte)((byte)uVar23 | *plVar27 == 0) == 1) {
      pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar39 & 1) != 0) {
        pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
      }
      aStack_60.data = 0x2ceb45;
      pMVar17 = ClassData::New(pTVar19->class_data,pAVar39);
      *plVar27 = (long)pMVar17;
      aVar21 = aVar29;
    }
    uVar51 = (undefined4)aVar21.data;
    if ((uVar46 & 0x1c0) == 0x40) {
      iVar9 = *(int *)(aStack_58.data + 0x58);
      lVar13 = (long)iVar9 + -1;
      iVar47 = (int)lVar13;
      *(int *)(aStack_58.data + 0x58) = iVar47;
      if ((long)iVar9 < 1) {
        return (char *)0x0;
      }
      lVar49 = (long)*(int *)(aStack_58.data + 0x5c) + 1;
      iVar9 = (int)lVar49;
      *(int *)(aStack_58.data + 0x5c) = iVar9;
      aStack_60.data = 0x2ceb93;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,(char *)aVar29,(ParseContext *)aStack_58,pTVar19)
      ;
      if (pcVar18 == (char *)0x0) {
LAB_002cebd2:
        *(int *)(aStack_58.data + 0x5c) = *(int *)(aStack_58.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar3 = *(uint32_t *)(aStack_58.data + 0x50);
        *(uint32_t *)(aStack_58.data + 0x50) = 0;
        if (uVar3 == (uint32_t)UNRECOVERED_JUMPTABLE_00) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar47 == iVar4) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60.data = 0x2ced44;
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar13,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar12 == (Nonnull<const_char_*>)0x0) {
        if (iVar9 == *(int *)(aStack_58.data + 0x5c)) {
          pcVar12 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_60.data = 0x2ced77;
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar49,(long)*(int *)(aStack_58.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar12 == (Nonnull<const_char_*>)0x0) goto LAB_002cebd2;
        iVar9 = 0x492;
      }
      else {
        iVar9 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aVar29 < '\0') {
        aStack_60.data = 0x2cec05;
        pVar58 = ReadSizeFallback((char *)aVar29,(uint)*(byte *)aVar29);
        pcVar12 = pVar58.first;
      }
      else {
        pcVar12 = (char *)(aVar29.data + 1);
      }
      if ((pcVar12 == (char *)0x0) || (*(int *)(aStack_58.data + 0x58) < 1)) {
        pcVar12 = (char *)0x0;
      }
      else {
        aStack_60.data = 0x2cec2f;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_40,(char *)aStack_58,(int)pcVar12);
        *(int *)(aStack_58.data + 0x58) = *(int *)(aStack_58.data + 0x58) + -1;
        uVar51 = aStack_40.data._0_4_;
      }
      if (pcVar12 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar9 = *(int *)(aStack_58.data + 0x58);
      aStack_60.data = 0x2cec59;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,pcVar12,(ParseContext *)aStack_58,pTVar19);
      if (pcVar18 == (char *)0x0) {
LAB_002cec7c:
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar10 = uVar51 + *(int *)(aStack_58.data + 0x1c);
        *(uint *)(aStack_58.data + 0x1c) = uVar10;
        if (*(uint32_t *)(aStack_58.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_58 = *(char **)(aStack_58.data + 8) + (int)((int)uVar10 >> 0x1f & uVar10);
        return pcVar18;
      }
      iVar47 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar9 == iVar47) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60.data = 0x2ced5f;
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar9,(long)iVar47,"old_depth == depth_");
      }
      if (pcVar12 == (Nonnull<const_char_*>)0x0) goto LAB_002cec7c;
      iVar9 = 0x481;
    }
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_002ced28:
    aStack_60.data = 0x2ced2d;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_40,pcVar18,iVar9,pcVar12);
    aStack_60.data = 0x2ced35;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_40);
  case 7:
    aVar40.data = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
    if ((aVar40.data & 3) != 0) {
LAB_002cf305:
      AlignFail();
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar34 & 7) != 2)) {
      pcVar12 = MpFallback(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar51 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset);
    aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar40;
    aVar42.data = hasbits;
    aStack_50.data = aVar40.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar50.data & 7) != 0) {
LAB_002cf30a:
        AlignFail(aVar50.data);
      }
      if ((*(ulong *)aVar50 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar50.data,1);
      }
      aVar50.data = aVar50.data + 0x10;
    }
    else if ((aVar50.data & 7) != 0) goto LAB_002cf30a;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar51;
    aStack_58.data._5_3_ = 0;
    aVar40.data = (uint64_t)&aStack_60;
    do {
      pcVar12._2_6_ = 0;
      pcVar12._0_2_ = *(ushort *)(aVar50.data + 0xc);
      aVar21.data = (uint64_t)UntypedMapBase::AllocNode(aVar50.data,(size_t)pcVar12);
      uVar46 = *(ushort *)(aVar50.data + 0xc);
      uVar23 = (ulong)uVar46 - 8;
      if (uVar23 < 8) {
        pcVar12 = (char *)0x8;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar23,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
      }
      else {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar9 = 0xb2c;
LAB_002cf355:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_80,pcVar12,iVar9,pcVar15);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_80);
      }
      *(char **)(aVar21.data + 8) = (char *)0x0;
      *(undefined8 *)((long)(aVar21.data - 8) + (ulong)uVar46) = 0;
      aVar33.data = (uint64_t)&aStack_48;
      f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
             *)aVar33.data;
      f.this = (UntypedMapBase *)aVar50.data;
      f.node = (NodeBase **)aVar40.data;
      aStack_80 = aVar50;
      aStack_78.data = aVar33.data;
      aStack_70.data = aVar40.data;
      aStack_60 = aVar21;
      aStack_48 = aVar50;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar50,f);
      aStack_40.data = (uint64_t)&aStack_88;
      f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)aVar33.data;
      f_00.this = (UntypedMapBase *)aVar50.data;
      f_00.node = (NodeBase **)aVar40.data;
      aVar38 = aVar50;
      wire_bytes._M_len = aVar50;
      aStack_80 = aVar50;
      aStack_78.data = aVar33.data;
      aStack_70.data = aVar40.data;
      aStack_60 = aVar21;
      aStack_48 = aVar50;
      aStack_38 = aVar50;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar50,f_00);
      bVar1 = *(byte *)aVar29;
      aVar26.data._1_7_ = 0;
      aVar26.data._0_1_ = bVar1;
      if ((char)bVar1 < '\0') {
        pcVar12._4_4_ = 0;
        pcVar12._0_4_ = CONCAT31(0,bVar1);
        pVar56 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
        aVar26.data = pVar56._8_8_ & 0xffffffff;
      }
      else {
        pVar56._8_8_ = extraout_RDX_02;
        pVar56.first = (char *)(aVar29.data + 1);
        aVar29 = aVar38;
      }
      pPVar28 = pVar56._8_8_;
      aVar38.data = (uint64_t)pVar56.first;
      if (((EpsCopyInputStream *)aVar38.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
        aVar38.data = 0;
      }
      else {
        aVar29.data = (uint64_t)&aStack_80;
        pcVar12 = (char *)ctx;
        EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar29,(char *)ctx,(int)pVar56.first);
        auStack_68._4_4_ = aStack_80.data._0_4_;
        ctx->depth_ = ctx->depth_ + -1;
        pPVar28 = extraout_RDX_03;
      }
      if ((EpsCopyInputStream *)aVar38.data == (EpsCopyInputStream *)0x0) {
LAB_002cf010:
        ctx_00 = (ParseContext *)0x0;
      }
      else {
        iVar9 = ctx->depth_;
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar9;
        aVar26 = aStack_88;
        aVar29 = aVar21;
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
        aVar42 = aStack_50;
        wire_bytes._M_len = aVar50;
        ctx_00 = (ParseContext *)
                 ParseOneMapEntry((NodeBase *)aVar21,(char *)aVar38,ctx,(FieldAux *)aStack_88,table,
                                  (FieldEntry *)aStack_50,(UntypedMapBase *)aVar50);
        pPVar28 = extraout_RDX_04;
        if (ctx_00 != (ParseContext *)0x0) {
          aVar38 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
          if (iVar9 == ctx->depth_) {
            pcVar15 = (Nonnull<const_char_*>)0x0;
          }
          else {
            aVar29 = aVar33;
            pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (aVar33.data,aVar38.data,"old_depth == depth_");
            pPVar28 = extraout_RDX_05;
          }
          if (pcVar15 != (Nonnull<const_char_*>)0x0) {
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
            ;
            iVar9 = 0x481;
            goto LAB_002cf355;
          }
        }
        ctx->depth_ = ctx->depth_ + 1;
        aVar37._0_4_ = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
        (ctx->super_EpsCopyInputStream).limit_ = aVar37._0_4_;
        pcVar12 = (char *)aVar38;
        if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_002cf010;
        aVar26._0_4_ = (int)aVar37._0_4_ >> 0x1f & aVar37._0_4_;
        aVar26.data._4_4_ = 0;
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar26._0_4_;
      }
      if (ctx_00 == (ParseContext *)0x0) {
        if (*(long *)(aVar50.data + 0x18) == 0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)aVar50,(NodeBase *)aVar21);
          pPVar28 = extraout_RDX_06;
          pcVar12 = (char *)aVar21;
        }
        pcVar12 = Error(msg,pcVar12,pPVar28,(TcFieldData)aVar26,table,hasbits);
        return pcVar12;
      }
      if ((bStack_a9 & 0x10) == 0) {
LAB_002cf054:
        if (5 < ((byte)(*(uint *)(aVar50.data + 0xc) >> 0x18) & 0xf)) {
switchD_002cf07a_caseD_3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        }
        aVar37._0_4_ = *(uint *)(aVar50.data + 0xc) >> 0x18 & 0xf;
        puVar22 = &switchD_002cf07a::switchdataD_0048104c;
        failure_msg = (int *)((long)&switchD_002cf07a::switchdataD_0048104c +
                             (long)(int)(&switchD_002cf07a::switchdataD_0048104c)[aVar37._0_4_]);
        switch(aVar37._0_4_) {
        case 0:
          KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar50,(KeyNode *)aVar21);
          break;
        case 1:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)aVar50,(KeyNode *)aVar21);
          break;
        case 2:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)aVar50,(KeyNode *)aVar21);
          break;
        default:
          goto switchD_002cf07a_caseD_3;
        case 5:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)aVar50,(KeyNode *)aVar21);
          break;
        case 6:
          LOCK();
          iVar9 = *(int *)(aVar33.data + (long)failure_msg);
          *(int *)(aVar33.data + (long)failure_msg) = (int)failure_msg;
          pcVar18 = (char *)CONCAT44((int)((ulong)failure_msg >> 0x20),iVar9);
          UNLOCK();
          *pcVar18 = *pcVar18 + (char)iVar9;
          goto code_r0x002d0a6c;
        case 7:
          cRam0000000001685173 = (cRam0000000001685173 + -0x4c) - (0xef < (byte)aVar33.data);
          goto code_r0x002d0a9c;
        case 8:
          pcVar18 = (char *)(ulong)(((int)failure_msg - *failure_msg) -
                                   (uint)(0xffffffffffb7efb3 <
                                         (ulong)(long)(int)(&switchD_002cf07a::switchdataD_0048104c)
                                                           [aVar37._0_4_]));
          goto code_r0x002d0a6c;
        case 9:
        case 10:
          goto switchD_002cf07a_caseD_9;
        case 0xb:
          goto switchD_002d0a7d_caseD_2;
        case 0xc:
          pcVar12 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                              ((MessageLite *)wire_bytes._M_len,pcVar12,pPVar28,
                               (TcFieldData)0x48104b,(TcParseTableBase *)aVar43,aVar42.data);
          return pcVar12;
        case 0xd:
          goto switchD_002d0a7d_caseD_9;
        case 0xe:
          goto code_r0x002d0f02;
        case 0xf:
          aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar22;
          ctx_00 = pPVar28;
          ctx = (ParseContext *)pcVar12;
          aVar40 = aVar29;
          aVar50 = aVar43;
          goto code_r0x002d0f02;
        }
      }
      else {
        puVar22 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar50,(NodeBase *)aVar21)
        ;
        aVar37._0_4_ = *puVar22;
        puVar22 = *(uint **)(aStack_88.data + 8);
        pcVar12 = (char *)(long)(short)*puVar22;
        aVar29.data._0_4_ = *puVar22 >> 0x10;
        aVar29.data._4_4_ = 0;
        pPVar28 = (ParseContext *)(((long)(int)aVar37._0_4_ - (long)pcVar12) - (long)aVar29);
        if ((EpsCopyInputStream *)((long)(int)aVar37._0_4_ - (long)pcVar12) < aVar29.data)
        goto LAB_002cf054;
        uVar24 = puVar22[1];
        pcVar12._4_4_ = 0;
        pcVar12._0_4_ = uVar24;
        aVar29.data._2_6_ = 0;
        aVar29.data._0_2_ = (ushort)uVar24;
        if (aVar29.data <= pPVar28) {
          pPVar28 = (ParseContext *)(ulong)(uVar24 >> 0x10);
          aVar26.data = 0;
          do {
            pcVar12 = (char *)aVar26;
            aVar29._1_7_ = (undefined7)((ulong)aVar29 >> 8);
            aVar29.data._0_1_ = pcVar12 < pPVar28;
            if (pcVar12 >= pPVar28) goto LAB_002cf124;
            uVar45 = *(uint *)((long)puVar22 + (long)pcVar12 * 4 + (ulong)(uVar24 >> 3 & 0x1ffc) + 8
                              );
            aVar29.data._4_4_ = 0;
            aVar29.data._0_4_ = uVar45;
            aVar42.data._1_7_ = 0;
            aVar42.data._0_1_ = (int)aVar37._0_4_ < (int)uVar45;
            aVar43.data = ((long)pcVar12 * 2 - (long)aVar42) + 2;
            aVar26.data = aVar43.data;
          } while (uVar45 != aVar37._0_4_);
          goto LAB_002cf054;
        }
        aVar29.data._1_1_ = (char)(uVar24 >> 8);
        aVar29.data._0_1_ = (puVar22[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0;
        aVar29.data._2_6_ = 0;
LAB_002cf124:
        if ((char)aVar29.data != '\0') goto LAB_002cf054;
        aVar42 = aStack_58;
        WriteMapEntryAsUnknown
                  (msg,table,(UntypedMapBase *)aVar50,uVar34,(NodeBase *)aVar21,
                   SUB85(aStack_58.data,0));
        aVar43 = aVar21;
      }
      pPVar28 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
      if (pPVar28 <= ctx_00) {
        uVar23 = (ulong)table->has_bits_offset;
        if (uVar23 == 0) {
          return (char *)ctx_00;
        }
        goto LAB_002cf265;
      }
      bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      aVar37._0_4_ = (uint)bVar1;
      aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
      if ((char)bVar1 < '\0') {
        uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
        lVar13 = CONCAT71(uVar36,*(char *)aVar29);
        if (*(char *)aVar29 < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
          lVar13 = CONCAT71(uVar36,cVar2);
          if (cVar2 < '\0') {
            uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
            lVar13 = CONCAT71(uVar36,cVar2);
            if (cVar2 < '\0') {
              uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
              cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
              if (cVar2 < '\0') {
                aVar37._0_4_ = 0;
                aVar29.data = 0;
              }
              else {
                aVar37._0_4_ = (int)CONCAT71(uVar36,cVar2) << 0x1c | (uint)(uVar36 >> 0x1c);
                aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
              }
            }
            else {
              aVar37._0_4_ = (int)lVar13 << 0x15 | (uint)(uVar36 >> 0x23);
              aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
            }
          }
          else {
            aVar37._0_4_ = (int)lVar13 << 0xe | (uint)(uVar36 >> 0x2a);
            aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
          }
        }
        else {
          aVar37._0_4_ = (int)lVar13 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
          aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
        }
      }
    } while (aVar37._0_4_ == uVar34);
    if (ctx_00 < pPVar28) {
      uVar46 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      uVar10 = (uint)table->fast_idx_mask & (uint)uVar46;
      if ((uVar10 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar23 = (ulong)(uVar10 & 0xfffffff8);
      pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                  (msg,ctx_00,ctx,
                                   (ulong)uVar46 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                   table,hasbits);
      return pcVar12;
    }
    uVar23 = (ulong)table->has_bits_offset;
    if (uVar23 != 0) {
LAB_002cf265:
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + uVar23);
      if (((ulong)puVar22 & 3) != 0) goto LAB_002cf305;
      *puVar22 = *puVar22 | uVar10;
    }
    return (char *)ctx_00;
  case 8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        AlignFail();
      }
      *puVar22 = *puVar22 | uVar10;
    }
    return (char *)0x0;
  case 9:
    pFVar11 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    if (((ulong)pFVar11 & 3) != 0) {
      aStack_80.data = 0x2cf677;
      AlignFail(pFVar11);
    }
    uVar46 = pFVar11->type_card;
    uVar10 = uVar46 & 0x30;
    if (uVar10 == 0x20) {
      pcVar12 = MpRepeatedVarint<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if ((uVar34 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_002cf400;
    }
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar29;
    if ((long)aVar43.data < 0) {
      aVar50.data = 0xffffffffffffff80;
      aVar40.data = (long)*(char *)(aVar29.data + 1) << 7 | 0x7f;
      if ((long)aVar40 < 0) {
        uVar23 = (long)*(char *)(aVar29.data + 2) << 0xe | 0x3fff;
        if ((long)uVar23 < 0) {
          aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar40 < 0) {
            uVar23 = uVar23 & ((long)*(char *)(aVar29.data + 4) << 0x1c | 0xfffffffU);
            if ((long)uVar23 < 0) {
              aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar40 < 0) {
                uVar23 = uVar23 & ((long)*(char *)(aVar29.data + 6) << 0x2a | 0x3ffffffffffU);
                if ((long)uVar23 < 0) {
                  aVar40.data = aVar40.data &
                                ((long)*(char *)(aVar29.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar40 < 0) {
                    uVar23 = uVar23 & ((ulong)*(byte *)(aVar29.data + 8) << 0x38 | 0xffffffffffffff)
                    ;
                    if ((long)uVar23 < 0) {
                      aStack_60.data = aVar29.data + 10;
                      if (*(char *)(aVar29.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar29.data + 9);
                        aVar50.data._1_7_ = 0xffffffffffffff;
                        aVar50.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aStack_60.data = 0;
                          goto LAB_002cf424;
                        }
                        if ((bVar1 & 1) == 0) {
                          uVar23 = uVar23 ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      aStack_60.data = aVar29.data + 9;
                    }
                  }
                  else {
                    aStack_60.data = aVar29.data + 8;
                  }
                }
                else {
                  aStack_60.data = aVar29.data + 7;
                }
              }
              else {
                aStack_60.data = aVar29.data + 6;
              }
            }
            else {
              aStack_60.data = aVar29.data + 5;
            }
          }
          else {
            aStack_60.data = aVar29.data + 4;
          }
        }
        else {
          aStack_60.data = aVar29.data + 3;
        }
        aVar40.data = aVar40.data & uVar23;
      }
      else {
        aStack_60.data = aVar29.data + 2;
      }
      aVar43.data = aVar43.data & aVar40.data;
    }
    else {
      aStack_60.data = aVar29.data + 1;
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aVar50 = aVar29;
    }
LAB_002cf424:
    if ((EpsCopyInputStream *)aStack_60.data == (EpsCopyInputStream *)0x0) {
      pcVar12 = Error(msg,(char *)aVar50,ctx,(TcFieldData)aVar40,table,hasbits);
      return pcVar12;
    }
    aVar37._0_4_ = uVar46 & 0x600;
    pPVar28 = (ParseContext *)(ulong)aVar37._0_4_;
    aStack_48.data._0_4_ = uVar46 & 0x1c0;
    aStack_48.data._4_4_ = 0;
    aStack_50.data = (ulong)CONCAT24(uVar46,aStack_50._0_4_) & 0x1c0ffffffff;
    uVar24 = (uint)aVar43.data;
    if ((EpsCopyInputStream *)aStack_48.data == (EpsCopyInputStream *)0xc0) {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aVar37._0_4_ == 0x200) {
        aVar43.data = -(ulong)(uVar24 & 1) ^ aVar43.data >> 1;
      }
    }
    else {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aStack_48.data._0_4_ == 0x80) {
        if ((uVar46 >> 10 & 1) == 0) {
          if (aVar37._0_4_ == 0x200) {
            aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (long)(int)(-(uVar24 & 1) ^ (uint)(aVar43.data >> 1) & 0x7fffffff);
          }
        }
        else {
          puVar6 = *(uint32_t **)
                    ((long)&table->has_bits_offset +
                    (ulong)pFVar11->aux_idx * 8 + (ulong)table->aux_offset);
          if (aVar37._0_4_ == 0x600) {
            bVar52 = (int)puVar6 <= (int)uVar24;
            pPVar28 = (ParseContext *)(ulong)CONCAT31(6,bVar52);
            bVar52 = (int)uVar24 <= (int)((ulong)puVar6 >> 0x20) && bVar52;
          }
          else {
            aStack_80.data = 0x2cf505;
            aStack_70 = aVar43;
            bVar52 = ValidateEnum(uVar24,puVar6);
            aVar43 = aStack_70;
          }
          if (bVar52 == false) {
            pcVar12 = MpUnknownEnumFallback
                                (msg,(char *)aVar29,(ParseContext *)aStack_58,
                                 (TcFieldData)UNRECOVERED_JUMPTABLE_00,table,(uint64_t)auStack_68);
            return pcVar12;
          }
        }
      }
    }
    aStack_70 = aVar43;
    if (uVar10 == 0x30) {
      aStack_80.data = 0x2cf562;
      ChangeOneof(table,pFVar11,uVar34 >> 3,pPVar28,msg);
    }
    else if (uVar10 == 0x10) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar11->has_idx >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_80.data = 0x2cf6e6;
        AlignFail();
      }
      *puVar22 = *puVar22 | 1 << ((byte)pFVar11->has_idx & 0x1f);
    }
    aStack_80.data = 0x2cf572;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_58;
    if (aStack_50._4_4_ == 0xc0) {
      paVar31 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)pvVar20 + (ulong)pFVar11->offset);
      if (((ulong)paVar31 & 7) != 0) {
        aStack_80.data = 0x2cf6e1;
        AlignFail(paVar31);
      }
      paVar31->data = (uint64_t)aStack_70;
    }
    else if (aStack_50._4_4_ == 0x80) {
      puVar32 = (undefined4 *)((long)pvVar20 + (ulong)pFVar11->offset);
      if (((ulong)puVar32 & 3) != 0) {
        aStack_80.data = 0x2cf71e;
        AlignFail(puVar32);
      }
      *puVar32 = (int)aStack_70.data;
    }
    else {
      if (aStack_50._4_4_ == 0) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x2cf704;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aStack_48.data,0,
                             "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x2cf7ca;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar15);
        aStack_80.data = 0x2cf7d2;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)pvVar20 + (ulong)pFVar11->offset) =
           (EpsCopyInputStream *)aStack_70.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aStack_60.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_80.data = 0x2cf6ee;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | auStack_68._0_4_;
      }
      return (char *)aStack_60.data;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aStack_60;
    if ((uVar10 & 7) != 0) {
      aStack_80.data = 0x2cf736;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aStack_60 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
    aVar29 = aStack_60;
    hasbits = (uint64_t)auStack_68;
LAB_002cf400:
    pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 10:
    uVar23 = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
    if ((uVar23 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cf930;
      AlignFail();
    }
    if ((uVar34 & 7) != 2) {
      pcVar12 = MpRepeatedVarint<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar46 = *(ushort *)(uVar23 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cf938;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | uVar10;
    }
    uVar30 = uVar46 >> 6;
    uVar8 = uVar30 & 7;
    if ((uVar30 & 7) == 0) {
      pcVar12 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if (uVar8 == 2) {
      pcVar12 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if (uVar8 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cf95f;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    uVar10 = uVar46 & 0x600;
    if ((short)uVar10 != 0) {
      if (uVar10 == 0x200) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_50.data = 0x2cf949;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar10,0x200,"xform_val == +field_layout::kTvZigZag");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cf97b;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x8db,pcVar15);
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_002cf983;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
    }
    pcVar12 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 0xb:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    pFVar11 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) goto LAB_002cfb3f;
    uVar46 = pFVar48->type_card & 0x30;
    if (uVar46 == 0x20) {
      pcVar12 = MpRepeatedFixed<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar10 = pFVar48->type_card & 0x1c0;
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar10 == 0xc0) {
      if ((uVar34 & 7) != 1) {
LAB_002cfa54:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_002cfb02;
      }
    }
    else {
      if (uVar10 == 0x80) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x2cfb6c;
        aStack_60.data = hasbits;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48 = aVar29;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar10,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar29 = aStack_48;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_60.data;
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cfba6;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar15);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cfbae;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar34 & 7) != 5) goto LAB_002cfa54;
    }
    aStack_60.data = hasbits;
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if (uVar46 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cfa76;
      ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)aVar43,msg);
    }
    else if (uVar46 == 0x10) {
      pFVar11 = (FieldEntry *)((long)msg + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
      if (((ulong)pFVar11 & 3) != 0) goto LAB_002cfb3f;
      pFVar11->offset = pFVar11->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
    }
    aStack_70.data = 0x2cfa90;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    pFVar11 = (FieldEntry *)((ulong)pFVar48->offset + (long)pvVar20);
    if (uVar10 == 0xc0) {
      if (((ulong)pFVar11 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cfb8a;
        AlignFail();
      }
      uVar7 = *(undefined8 *)aVar29;
      pFVar11->offset = (int)uVar7;
      pFVar11->has_idx = (int)((ulong)uVar7 >> 0x20);
      lVar13 = 8;
    }
    else {
      if (((ulong)pFVar11 & 3) != 0) goto LAB_002cfb3f;
      pFVar11->offset = *(uint32_t *)aVar29;
      lVar13 = 4;
    }
    aVar29.data = aVar29.data + lVar13;
    if (aVar29.data < *(EpsCopyInputStream **)aStack_58) {
      uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
      if ((uVar10 & 7) != 0) {
        aStack_70.data = (uint64_t)MpPackedFixed<true>;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar23 = (ulong)(uVar10 & 0xfffffff8);
      UNRECOVERED_JUMPTABLE_00 =
           (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
      UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
      ctx = (ParseContext *)aStack_58;
      hasbits = aStack_60.data;
LAB_002cfb02:
      pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar11 = (FieldEntry *)((long)msg + (ulong)table->has_bits_offset);
      if (((ulong)pFVar11 & 3) != 0) {
LAB_002cfb3f:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2cfb44;
        AlignFail(pFVar11);
      }
      pFVar11->offset = pFVar11->offset | (uint)aStack_60.data;
    }
    return (char *)aVar29.data;
  case 0xc:
    puVar22 = (uint *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    if (((ulong)puVar22 & 3) != 0) {
      aStack_60.data = 0x2cfdd8;
      AlignFail(puVar22);
    }
    if ((uVar34 & 7) != 2) {
      pcVar12 = MpRepeatedFixed<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar46 = *(ushort *)((long)puVar22 + 10);
    aStack_60.data = 0x2cfc19;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48.data = hasbits;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    bVar1 = *(byte *)aVar29;
    uVar10 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60.data = 0x2cfc50;
      pVar58 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      uVar10 = pVar58.second;
      pcVar12 = pVar58.first;
    }
    else {
      pcVar12 = (char *)(aVar29.data + 1);
    }
    uVar34 = uVar46 & 0x1c0;
    if ((ulong)uVar34 == 0xc0) {
      puVar35 = (uint64_t *)((long)pvVar20 + (ulong)*puVar22);
      if (((ulong)puVar35 & 7) != 0) {
LAB_002cfdd8:
        aStack_60.data = 0x2cfde0;
        AlignFail(puVar35);
      }
      if ((undefined1 *)*puVar35 == kZeroBuffer) {
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar29.data & 1) != 0) {
          aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar29.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar29.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60.data = 0x2cfe38;
          this = (RepeatedField<unsigned_long> *)operator_new(0x10);
          aStack_60.data = 0x2cfe45;
          RepeatedField<unsigned_long>::RepeatedField(this,(Arena *)0x0);
        }
        else {
          aStack_60.data = 0x2cfca5;
          pvVar20 = Arena::Allocate((Arena *)aVar29,0x10);
          aStack_60.data = 0x2cfcb5;
          aStack_40 = aVar29;
          this = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                 Construct<google::protobuf::Arena*>(pvVar20,(Arena **)&aStack_40);
        }
        *puVar35 = (uint64_t)this;
      }
      aVar43 = aStack_50;
      aVar29.data = *puVar35;
      aStack_60.data = 0x2cfcd3;
      puVar14 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          ((EpsCopyInputStream *)aStack_50,pcVar12,uVar10,
                           (RepeatedField<unsigned_long> *)aVar29);
      pPVar28 = extraout_RDX_07;
    }
    else {
      if (uVar34 == 0x80) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_58.data._4_4_ = uVar10;
        aStack_60.data = 0x2cfe11;
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar34,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uVar10 = (uint)((ulong)aStack_58 >> 0x20);
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        aStack_60.data = 0x2cfe8e;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar15);
        aStack_60.data = 0x2cfe96;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      puVar35 = (uint64_t *)((long)pvVar20 + (ulong)*puVar22);
      if (((ulong)puVar35 & 7) != 0) goto LAB_002cfdd8;
      if ((undefined1 *)*puVar35 == kZeroBuffer) {
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar29.data & 1) != 0) {
          aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar29.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar29.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60.data = 0x2cfe60;
          this_00 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          aStack_60.data = 0x2cfe6d;
          RepeatedField<unsigned_int>::RepeatedField(this_00,(Arena *)0x0);
        }
        else {
          aStack_60.data = 0x2cfd32;
          pvVar20 = Arena::Allocate((Arena *)aVar29,0x10);
          aStack_60.data = 0x2cfd42;
          aStack_40 = aVar29;
          this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                    Construct<google::protobuf::Arena*>(pvVar20,(Arena **)&aStack_40);
        }
        *puVar35 = (uint64_t)this_00;
      }
      aVar43 = aStack_50;
      aVar29.data = *puVar35;
      aStack_60.data = 0x2cfd60;
      puVar14 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          ((EpsCopyInputStream *)aStack_50,pcVar12,uVar10,
                           (RepeatedField<unsigned_int> *)aVar29);
      pPVar28 = extraout_RDX_08;
    }
    if (puVar14 == (ushort *)0x0) {
      pcVar12 = Error(msg,pcVar12,pPVar28,(TcFieldData)aVar29,table,aStack_48.data);
      return pcVar12;
    }
    if ((((ParseContext *)aVar43.data)->super_EpsCopyInputStream).limit_end_ <= puVar14) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60.data = 0x2cfe22;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_48.data;
      }
      return (char *)puVar14;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*puVar14;
    if ((uVar10 & 7) != 0) {
      aStack_60.data = (uint64_t)&LAB_002cfeae;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                (msg,puVar14,aVar43.data,
                                 (ulong)*puVar14 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),
                                 table);
    return pcVar12;
  case 0xd:
    aVar43.data = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
    if ((aVar43.data & 3) != 0) {
      aStack_60.data = 0x2d02cd;
      AlignFail(aVar43.data);
    }
    if ((uVar34 & 7) != 2) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_002cff34;
    }
    uVar46 = *(ushort *)(aVar43.data + 10);
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      pcVar12 = MpRepeatedString<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    if (uVar30 == 0x10) {
      uVar10 = *(uint *)(aVar43.data + 4);
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar10;
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar10 >> 5) * 4);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_60.data = 0x2d02f3;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_38.data = hasbits;
        AlignFail();
      }
      *puVar22 = *puVar22 | 1 << ((byte)uVar10 & 0x1f);
LAB_002cff9c:
      aStack_58.data = aStack_58.data & 0xffffffff00000000;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
    }
    else {
      if (uVar30 != 0x30) goto LAB_002cff9c;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar34 >> 3;
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      aStack_60.data = 0x2cff94;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      bVar52 = ChangeOneof(table,(FieldEntry *)aVar43,UNRECOVERED_JUMPTABLE_00._0_4_,
                           (ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._0_4_ = (int)CONCAT71(extraout_var_00,bVar52);
    }
    uVar44 = (uint16_t)hasbits;
    aStack_48.data = (ulong)CONCAT24(uVar46,aStack_48.data._0_4_) & 0x600ffffffff;
    aVar40.data = 1;
    aStack_60.data = 0x2cffc6;
    aVar50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_50;
    if ((uVar46 & 0x1c0) == 0x140) {
      aVar42.data = (long)pvVar20 + (ulong)*(uint *)aVar43;
      if ((aVar42.data & 7) != 0) goto LAB_002d02e9;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 *)aVar42 = 0;
      }
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar40.data & 1) != 0) {
        aVar40 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar40.data & 0xfffffffffffffffe);
      }
      uVar10 = (uint)*(byte *)aVar29;
      aStack_40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      if ((char)*(byte *)aVar29 < '\0') {
        aStack_60.data = 0x2d010e;
        pVar58 = ReadSizeFallback((char *)aVar29,uVar10);
        pcVar12 = pVar58.first;
        uVar10 = pVar58.second;
      }
      else {
        pcVar12 = (char *)(aVar29.data + 1);
      }
      aVar29 = aStack_50;
      if (pcVar12 == (char *)0x0) {
        aVar50.data = 0;
      }
      else {
        aStack_60.data = 0x2d0133;
        aStack_58 = aVar40;
        iVar9 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar12);
        if (iVar9 < (int)uVar10) {
          aStack_60.data = 0x2d014d;
          aVar50.data = (uint64_t)
                        EpsCopyInputStream::ReadMicroStringFallback
                                  (aVar29.data,pcVar12,uVar10,aVar42.data,aStack_58.data);
        }
        else {
          aStack_60.data = 0x2d01c1;
          sVar57._M_str = pcVar12;
          sVar57._M_len = (long)(int)uVar10;
          MicroString::SetImpl((MicroString *)aVar42,sVar57,(Arena *)aStack_58,7);
          aVar50.data = (long)pcVar12 + (long)(int)uVar10;
        }
      }
      aStack_60.data = 0x2d01cf;
      sVar57 = MicroString::Get((MicroString *)aVar42);
      aVar40.data = (uint64_t)sVar57._M_str;
      aStack_60.data = 0x2d01e6;
      wire_bytes_01._M_str = (char *)table;
      wire_bytes_01._M_len = aVar40.data;
      bVar52 = MpVerifyUtf8((TcParser *)sVar57._M_len,wire_bytes_01,(TcParseTableBase *)aVar43,
                            (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar44);
      pPVar28 = extraout_RDX_10;
      msg = (MessageLite *)aStack_40;
      ctx = (ParseContext *)aStack_50;
    }
    else if ((uVar46 & 0x1c0) == 0x80) {
      if (uVar30 == 0x30) {
        if (aStack_58._0_1_ == '\0') {
          aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
          aVar42.data = aVar50.data;
          if ((aVar50.data & 7) != 0) goto LAB_002d02e9;
          aVar42.data = *aVar50.data;
        }
        else {
          pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar39 & 1) != 0) {
            pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
          }
          if (pAVar39 == (Arena *)0x0) {
            aStack_60.data = 0x2d033b;
            aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          }
          else {
            UNRECOVERED_JUMPTABLE_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
            aVar40.data = 0x10;
            aStack_60.data = 0x2d0087;
            aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     Arena::AllocateAlignedWithCleanup
                               (pAVar39,0x10,8,
                                cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
          }
          *(undefined8 *)aVar21 = 0;
          *(char **)(aVar21.data + 8) = (char *)0x0;
          aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
          aVar42.data = aVar50.data;
          if ((aVar50.data & 7) != 0) {
LAB_002d02e9:
            aStack_60.data = 0x2d02ee;
            AlignFail(aVar42.data);
          }
          *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar50 = aVar21;
          aVar42 = aVar21;
        }
      }
      else {
        aVar42.data = (long)pvVar20 + (ulong)*(uint *)aVar43;
        if ((aVar42.data & 7) != 0) goto LAB_002d02e9;
      }
      bVar1 = *(byte *)aVar29;
      if ((char)bVar1 < '\0') {
        aVar40.data._4_4_ = 0;
        aVar40.data._0_4_ = CONCAT31(0,bVar1);
        aStack_60.data = 0x2d0228;
        pVar58 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      }
      else {
        pVar58.second._0_1_ = bVar1;
        pVar58.first = (undefined1 *)(aVar29.data + 1);
        pVar58._9_7_ = 0;
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
        aVar29 = aVar50;
      }
      pPVar28 = pVar58._8_8_;
      aVar21.data = (uint64_t)pVar58.first;
      if ((EpsCopyInputStream *)aVar21.data == (EpsCopyInputStream *)0x0) {
        aVar50.data = 0;
      }
      else {
        aStack_60.data = 0x2d0241;
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadCord
                                (&ctx->super_EpsCopyInputStream,(char *)aVar21,pVar58.second,
                                 aVar42.data);
        aVar43 = aVar42;
        pPVar28 = extraout_RDX_11;
        aVar40 = aVar21;
      }
      bVar52 = (EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0;
      if (bVar52) {
        aVar43.data._2_6_ = 0;
        aVar43.data._0_2_ = aStack_48.data._4_2_;
        aStack_60.data = 0x2d025b;
        MpVerifyUtf8((Cord *)aVar29,(TcParseTableBase *)aVar40,(FieldEntry *)pPVar28,
                     aStack_48.data._4_2_);
        bVar52 = true;
        pPVar28 = extraout_RDX_12;
      }
    }
    else {
      if ((uVar46 & 0x1c0) != 0) {
        aStack_60.data = (uint64_t)&UNK_002d0369;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aVar40.data = (long)pvVar20 + (ulong)*(uint *)aVar43;
      aVar42.data = aVar40.data;
      if ((aVar40.data & 7) != 0) goto LAB_002d02e9;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 **)aVar40 = &fixed_address_empty_string;
      }
      aVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar42.data & 1) != 0) {
        aVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar42.data & 0xfffffffffffffffe))->
                 data;
      }
      if (aVar42.data == 0) {
        aStack_60.data = 0x2d0167;
        psVar16 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)aVar40,(Arena *)0x0);
        aStack_60.data = 0x2d0175;
        aVar50.data = (uint64_t)InlineGreedyStringParser(psVar16,aVar29.data,ctx);
      }
      else {
        aStack_60.data = 0x2d0038;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadArenaString
                                (aStack_50.data,aVar29.data,aVar40.data,aVar42.data);
      }
      if ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0) {
        aStack_60.data = 0x2d0316;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)aVar40);
        bVar52 = false;
        aVar43 = aVar42;
        pPVar28 = extraout_RDX_13;
      }
      else {
        uVar23 = *(ulong *)aVar40;
        aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(uVar23 & 0xfffffffffffffffc))->data;
        aStack_60.data = 0x2d01a1;
        wire_bytes_00._M_str = (char *)table;
        wire_bytes_00._M_len = aVar40.data;
        bVar52 = MpVerifyUtf8((TcParser *)
                              ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                              (uVar23 & 0xfffffffffffffffc))[1],wire_bytes_00,
                              (TcParseTableBase *)aVar43,
                              (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar44);
        pPVar28 = extraout_RDX_09;
      }
    }
    aVar29 = aVar50;
    if ((bVar52 == false) || ((EpsCopyInputStream *)aVar29.data == (EpsCopyInputStream *)0x0)) {
      pcVar12 = Error(msg,(char *)aVar40,pPVar28,(TcFieldData)aVar43,table,aStack_38.data);
      return pcVar12;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar22 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar22 & 3) != 0) {
          aStack_60.data = 0x2d0325;
          AlignFail(puVar22);
        }
        *puVar22 = *puVar22 | (uint)aStack_38.data;
      }
      return (char *)aVar29.data;
    }
    uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar10 & 7) != 0) {
      aStack_60.data = 0x2d0358;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar23 = (ulong)(uVar10 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
    hasbits = aStack_38.data;
LAB_002cff34:
    pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  case 0xe:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)aVar37._0_4_);
    pFVar11 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) {
LAB_002d06af:
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d06b4;
      AlignFail(pFVar11);
    }
    uVar46 = pFVar48->type_card;
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      if ((uVar46 & 0x1c0) == 0x40) {
        pcVar12 = MpRepeatedMessageOrGroup<true,true>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      }
      if ((uVar46 & 0x1c0) == 0) {
        pcVar12 = MpRepeatedMessageOrGroup<true,false>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar12;
      }
LAB_002d0462:
      pcVar12 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar12;
    }
    if ((uVar46 & 0x1c0) == 0x40) {
      if ((uVar34 & 7) != 3) goto LAB_002d0462;
    }
    else if (((uVar46 & 0x1c0) != 0) || ((uVar34 & 7) != 2)) goto LAB_002d0462;
    aStack_50 = aVar29;
    aStack_38 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if (uVar30 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0492;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      bVar52 = ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._4_4_ = (int)CONCAT71(extraout_var_01,bVar52);
    }
    else {
      if (uVar30 == 0x10) {
        pFVar11 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar11 & 3) != 0) goto LAB_002d06af;
        pFVar11->offset = pFVar11->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
      }
      aStack_58.data = aStack_58.data & 0xffffffff;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d04a6;
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    if ((ulong)table->has_bits_offset != 0) {
      pFVar11 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar11 & 3) != 0) goto LAB_002d06af;
      pFVar11->offset = pFVar11->offset | uVar10;
    }
    plVar27 = (long *)((long)pvVar20 + (ulong)pFVar48->offset);
    if (((ulong)plVar27 & 7) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d06bc;
      AlignFail(plVar27);
    }
    pTVar19 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar48->aux_idx * 8 + (ulong)table->aux_offset);
    uVar51 = uVar46 >> 9 & 3;
    if ((short)uVar51 != 2) {
      if ((uVar46 >> 9 & 3) == 0) {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar12 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar9 = 0x9c8;
        goto LAB_002d0712;
      }
      if (uVar51 != 1) {
        pTVar19 = *(TcParseTableBase **)pTVar19;
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d06d6;
      pTVar19 = MessageLite::GetTcParseTable((MessageLite *)pTVar19);
    }
    if ((byte)((byte)((ulong)aStack_58 >> 0x20) | *plVar27 == 0) == 1) {
      pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar39 & 1) != 0) {
        pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0529;
      pMVar17 = ClassData::New(pTVar19->class_data,pAVar39);
      *plVar27 = (long)pMVar17;
    }
    if ((uVar46 & 0x1c0) == 0x40) {
      iVar9 = *(int *)(aStack_60.data + 0x58);
      lVar13 = (long)iVar9 + -1;
      iVar47 = (int)lVar13;
      *(int *)(aStack_60.data + 0x58) = iVar47;
      if ((long)iVar9 < 1) {
        return (char *)0x0;
      }
      lVar49 = (long)*(int *)(aStack_60.data + 0x5c) + 1;
      iVar9 = (int)lVar49;
      *(int *)(aStack_60.data + 0x5c) = iVar9;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0576;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,(char *)aStack_50,(ParseContext *)aStack_60,
                           pTVar19);
      uVar3 = (uint32_t)aStack_38.data;
      if (pcVar18 == (char *)0x0) {
LAB_002d05b8:
        *(int *)(aStack_60.data + 0x5c) = *(int *)(aStack_60.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar5 = *(uint32_t *)(aStack_60.data + 0x50);
        *(uint32_t *)(aStack_60.data + 0x50) = 0;
        if (uVar5 == uVar3) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar47 == iVar4) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0731;
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar13,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar12 == (Nonnull<const_char_*>)0x0) {
        if (iVar9 == *(int *)(aStack_60.data + 0x5c)) {
          pcVar12 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0769;
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar49,(long)*(int *)(aStack_60.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar12 == (Nonnull<const_char_*>)0x0) goto LAB_002d05b8;
        iVar9 = 0x492;
      }
      else {
        iVar9 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aStack_50 < '\0') {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d05ef;
        pVar58 = ReadSizeFallback((char *)aStack_50,(uint)*(byte *)aStack_50);
        pcVar12 = pVar58.first;
      }
      else {
        pcVar12 = (char *)(aStack_50.data + 1);
      }
      if ((pcVar12 == (char *)0x0) || (*(int *)(aStack_60.data + 0x58) < 1)) {
        pcVar12 = (char *)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d061d;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_48,(char *)aStack_60,(int)pcVar12);
        *(int *)(aStack_60.data + 0x58) = *(int *)(aStack_60.data + 0x58) + -1;
        uVar51 = aStack_48.data._0_4_;
      }
      if (pcVar12 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar9 = *(int *)(aStack_60.data + 0x58);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d064e;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,pcVar12,(ParseContext *)aStack_60,pTVar19);
      if (pcVar18 == (char *)0x0) {
LAB_002d0672:
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar10 = uVar51 + *(int *)(aStack_60.data + 0x1c);
        *(uint *)(aStack_60.data + 0x1c) = uVar10;
        if (*(uint32_t *)(aStack_60.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_60 = *(char **)(aStack_60.data + 8) + (int)((int)uVar10 >> 0x1f & uVar10);
        return pcVar18;
      }
      iVar47 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar9 == iVar47) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d074d;
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar9,(long)iVar47,"old_depth == depth_");
      }
      if (pcVar12 == (Nonnull<const_char_*>)0x0) goto LAB_002d0672;
      iVar9 = 0x481;
    }
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_002d0712:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d0717;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_48,pcVar18,iVar9,pcVar12);
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2d071f;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_48);
  case 0xf:
    aVar40.data = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
    if ((aVar40.data & 3) != 0) {
      AlignFail(aVar40.data);
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar34 & 7) != 2)) {
      pcVar12 = MpFallback(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar12;
    }
    uVar51 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset);
    pvVar20 = MaybeGetSplitBase(msg,true,table);
    aVar50.data = (ulong)*(uint *)aVar40 + (long)pvVar20;
    aStack_50.data = aVar40.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar50.data & 7) != 0) {
LAB_002d0d10:
        AlignFail(aVar50.data);
      }
      if ((*(ulong *)aVar50 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar50.data,1);
      }
      aVar50.data = aVar50.data + 0x10;
    }
    else if ((aVar50.data & 7) != 0) goto LAB_002d0d10;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar51;
    aStack_58.data._5_3_ = 0;
    goto LAB_002d089b;
  }
  aVar43.data = (long)&table->has_bits_offset + (ulong)aVar37._0_4_;
  if ((aVar43.data & 3) != 0) {
    aStack_60.data = 0x2ce8f4;
    AlignFail(aVar43.data);
  }
  if ((uVar34 & 7) != 2) {
    UNRECOVERED_JUMPTABLE_01 = table->fallback;
    goto LAB_002ce5ba;
  }
  uVar46 = *(ushort *)(aVar43.data + 10);
  uVar30 = uVar46 & 0x30;
  if (uVar30 == 0x20) {
    pcVar12 = MpRepeatedString<false>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar12;
  }
  if (uVar30 == 0x10) {
    aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)(*(uint *)(aVar43.data + 4) >> 5) * 4;
    if ((aVar40.data & 3) != 0) {
      aStack_60.data = 0x2ce912;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      AlignFail();
    }
    *(uint *)aVar40 = *(uint *)aVar40 | 1 << ((byte)*(uint *)(aVar43.data + 4) & 0x1f);
LAB_002ce624:
    bVar52 = false;
    aVar33 = aVar29;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
  }
  else {
    aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if (uVar30 != 0x30) goto LAB_002ce624;
    aStack_60.data = 0x2ce61d;
    aVar33.data = aVar43.data;
    aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
    bVar52 = ChangeOneof(table,(FieldEntry *)aVar43,uVar34 >> 3,(ParseContext *)(ulong)(uVar34 >> 3)
                         ,msg);
  }
  aVar50 = aStack_50;
  uVar44 = (uint16_t)hasbits;
  arena._0_4_ = uVar46 & 0x600;
  arena._4_4_ = 0;
  aStack_58.data = (ulong)CONCAT24(uVar46,aStack_58._0_4_) & 0x600ffffffff;
  if ((uVar46 & 0x1c0) == 0x140) {
    aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
    if ((aVar40.data & 7) != 0) goto LAB_002ce915;
    if (bVar52 != false) {
      *(uint64_t *)aVar40 = 0;
    }
    aStack_48 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if ((aStack_48.data & 1) != 0) {
      aStack_48 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   (aStack_48.data & 0xfffffffffffffffe);
    }
    bVar1 = *(byte *)aVar29;
    uVar10 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60.data = 0x2ce75c;
      pVar58 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      pcVar12 = pVar58.first;
      uVar10 = pVar58.second;
    }
    else {
      pcVar12 = (char *)(aVar29.data + 1);
    }
    aVar29 = aStack_50;
    if (pcVar12 == (char *)0x0) {
      aVar50.data = 0;
    }
    else {
      aStack_60.data = 0x2ce77e;
      aStack_40.data = aVar40.data;
      iVar9 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar12);
      aVar40 = aStack_40;
      if (iVar9 < (int)uVar10) {
        aStack_60.data = 0x2ce79c;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadMicroStringFallback
                                (aVar29.data,pcVar12,uVar10,aStack_40.data,aStack_48.data);
      }
      else {
        aStack_60.data = 0x2ce804;
        data_00._M_str = pcVar12;
        data_00._M_len = (long)(int)uVar10;
        MicroString::SetImpl((MicroString *)aStack_40,data_00,(Arena *)aStack_48,7);
        aVar50.data = (long)pcVar12 + (long)(int)uVar10;
      }
    }
    aStack_60.data = 0x2ce80f;
    sVar54 = MicroString::Get((MicroString *)aVar40);
LAB_002ce81b:
    wire_bytes._M_len = (uint64_t)sVar54._M_str;
    aStack_60.data = 0x2ce826;
    wire_bytes._M_str = (char *)table;
    bVar52 = MpVerifyUtf8((TcParser *)sVar54._M_len,wire_bytes,(TcParseTableBase *)aVar43,
                          (FieldEntry *)(ulong)(ushort)aStack_58.data._4_2_,uVar44);
    arena = (code *)aVar43;
  }
  else if ((uVar46 & 0x1c0) == 0x80) {
    if (uVar30 == 0x30) {
      if (bVar52 == false) {
        aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
        if ((aVar40.data & 7) != 0) goto LAB_002ce915;
        wire_bytes._M_len = *aVar40.data;
      }
      else {
        pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar39 & 1) != 0) {
          pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
        }
        if (pAVar39 == (Arena *)0x0) {
          aStack_60.data = 0x2ce962;
          wire_bytes._M_len = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          arena = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          aVar33.data = 0x10;
          aStack_60.data = 0x2ce6de;
          wire_bytes._M_len =
               (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               Arena::AllocateAlignedWithCleanup
                         (pAVar39,0x10,8,cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
        }
        *(undefined8 *)wire_bytes._M_len = 0;
        *(char **)(wire_bytes._M_len + 8) = (char *)0x0;
        aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
        if ((aVar40.data & 7) != 0) {
LAB_002ce915:
          aStack_60.data = 0x2ce91a;
          AlignFail(aVar40.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar40 = (uint64_t)wire_bytes._M_len;
      }
    }
    else {
      wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
      if ((wire_bytes._M_len & 7) != 0) goto LAB_002ce74a;
    }
    bVar1 = *(byte *)aVar29;
    if ((char)bVar1 < '\0') {
      aVar33.data._4_4_ = 0;
      aVar33.data._0_4_ = CONCAT31(0,bVar1);
      aStack_60.data = 0x2ce853;
      pVar55 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
    }
    else {
      pVar55.second._0_1_ = bVar1;
      pVar55.first = (undefined1 *)(aVar29.data + 1);
      pVar55._9_7_ = 0;
      aVar29 = aVar40;
    }
    entry = pVar55._8_8_;
    aVar43.data = (uint64_t)pVar55.first;
    if ((EpsCopyInputStream *)aVar43.data == (EpsCopyInputStream *)0x0) {
      aVar50.data = 0;
      wire_bytes._M_len = aVar33;
    }
    else {
      aStack_60.data = 0x2ce86b;
      aVar29 = aStack_50;
      aVar50.data = (uint64_t)
                    EpsCopyInputStream::ReadCord
                              (aStack_50.data,(char *)aVar43,pVar55.second,wire_bytes._M_len);
      arena = (code *)wire_bytes._M_len;
      entry = extraout_RDX_01;
      wire_bytes._M_len = aVar43;
    }
    bVar52 = (EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0;
    if (bVar52) {
      arena._2_6_ = 0;
      arena._0_2_ = aStack_58._4_2_;
      aStack_60.data = 0x2ce885;
      MpVerifyUtf8((Cord *)aVar29,(TcParseTableBase *)wire_bytes._M_len,entry,aStack_58._4_2_);
      bVar52 = true;
    }
  }
  else {
    if ((uVar46 & 0x1c0) != 0) {
      aStack_60.data = (uint64_t)MpMessage<false>;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
    if ((wire_bytes._M_len & 7) != 0) {
LAB_002ce74a:
      aStack_60.data = 0x2ce752;
      AlignFail(wire_bytes._M_len);
    }
    if (bVar52 != false) {
      *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
    }
    arena = (code *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                      ((ulong)arena & 0xfffffffffffffffe))->data;
    }
    if (arena == (code *)0x0) {
      aStack_60.data = 0x2ce7b3;
      psVar16 = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                          ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
      aStack_60.data = 0x2ce7c1;
      aVar50.data = (uint64_t)InlineGreedyStringParser(psVar16,aVar29.data,aVar50.data);
    }
    else {
      aStack_60.data = 0x2ce69a;
      aVar50.data = (uint64_t)
                    EpsCopyInputStream::ReadArenaString
                              (aStack_50.data,aVar29.data,wire_bytes._M_len,(Arena *)arena);
    }
    if ((EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0) {
      sVar54._M_str = *(char **)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar54._M_len = ((undefined8 *)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      goto LAB_002ce81b;
    }
    aStack_60.data = 0x2ce93d;
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
    bVar52 = false;
  }
  if ((bVar52 == false) || ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0)) {
    pcVar12 = Error(msg,(char *)wire_bytes._M_len,(ParseContext *)aStack_50,(TcFieldData)arena,table
                    ,aStack_38.data);
    return pcVar12;
  }
  if (*(EpsCopyInputStream **)aStack_50 <= aVar50.data) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar22 & 3) != 0) {
        aStack_60.data = 0x2ce94c;
        AlignFail(puVar22);
      }
      *puVar22 = *puVar22 | (uint)aStack_38.data;
    }
    return (char *)aVar50.data;
  }
  uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar50;
  if ((uVar10 & 7) != 0) {
    aStack_60.data = 0x2ce97f;
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar23 = (ulong)(uVar10 & 0xfffffff8);
  UNRECOVERED_JUMPTABLE_00 =
       (code *)((ulong)*(ushort *)aVar50 ^ *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2));
  UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar23);
  ctx = (ParseContext *)aStack_50;
  hasbits = aStack_38.data;
  aVar29 = aVar50;
LAB_002ce5ba:
  pcVar12 = (*UNRECOVERED_JUMPTABLE_01)
                      (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits);
  return pcVar12;
code_r0x002d0a6c:
  aVar37._0_4_ = (uint)pcVar18 & 0xf;
  puVar22 = &switchD_002d0a7d::switchdataD_00481064;
  uVar23 = (ulong)(int)(&switchD_002d0a7d::switchdataD_00481064)[aVar37._0_4_];
  bVar52 = 0xffffffffffb7ef9b < uVar23;
  UNRECOVERED_JUMPTABLE_00 = (code *)((long)&switchD_002d0a7d::switchdataD_00481064 + uVar23);
  bVar53 = UNRECOVERED_JUMPTABLE_00 == (code *)0x0;
  switch(aVar37._0_4_) {
  case 0:
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar50,(KeyNode *)aVar21);
    break;
  case 1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)aVar50,(KeyNode *)aVar21);
    break;
  case 2:
switchD_002d0a7d_caseD_2:
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)aVar50,(KeyNode *)aVar21);
    break;
  default:
    goto switchD_002d0a7d_caseD_3;
  case 5:
    aVar29 = aVar50;
code_r0x002d0a9c:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)aVar29,(KeyNode *)aVar21);
    break;
  case 6:
    pcVar12 = (char *)(*UNRECOVERED_JUMPTABLE_00)();
    return pcVar12;
  case 7:
    pcVar12 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                        ((MessageLite *)aVar29,pcVar12,pPVar28,(TcFieldData)0x481064,
                         (TcParseTableBase *)aVar43,aVar33.data);
    return pcVar12;
  case 8:
    aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar22;
    ctx_00 = pPVar28;
    ctx = (ParseContext *)pcVar12;
    aVar40 = aVar29;
    aVar50 = aVar43;
code_r0x002d0f02:
    pcVar12 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                        ((MessageLite *)aVar40,(char *)ctx,ctx_00,(TcFieldData)aVar21,
                         (TcParseTableBase *)aVar50,aVar33.data);
    return pcVar12;
  case 9:
    goto switchD_002d0a7d_caseD_9;
  case 10:
    if (bVar53) {
      cRam0000000000000000 = cRam0000000000000000 + (char)UNRECOVERED_JUMPTABLE_00;
      KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)aVar33,(map_index_t)ctx_00,(KeyNode *)aVar50);
      *(int *)aVar33 = *(int *)aVar33 + 1;
      return (char *)(CONCAT71((int7)((ulong)&aStack_60 >> 8),
                               (EpsCopyInputStream *)aVar21.data == (EpsCopyInputStream *)0x0) &
                     0xffffffff);
    }
    goto code_r0x002d50c1;
  case 0xb:
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)(*(byte *)(aVar29.data + 0xf) & 0xf);
  case 0xf:
    bVar52 = (uint)UNRECOVERED_JUMPTABLE_00 < 5;
    bVar53 = (uint)UNRECOVERED_JUMPTABLE_00 == 5;
code_r0x002d50c1:
    if (!bVar52 && !bVar53) {
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ();
    }
    puVar22 = &switchD_002d50d6::switchdataD_0048108c;
code_r0x002d50cf:
    pcVar12 = (char *)(*(code *)((long)(int)puVar22[(long)UNRECOVERED_JUMPTABLE_00] + (long)puVar22)
                      )();
    return pcVar12;
  case 0xc:
    if (SCARRY8(uVar23,0x481064) != (long)UNRECOVERED_JUMPTABLE_00 < 0) {
      return (char *)wire_bytes._M_len.data;
    }
    pcVar12 = (char *)((long)&UINT_00480ff0 + uVar23 + 1);
    *pcVar12 = *pcVar12 + 'd' + bVar52;
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)((uint)UNRECOVERED_JUMPTABLE_00 | 0x1abfbd);
    goto code_r0x002d50cf;
  case 0xd:
  case 0xe:
    UNRECOVERED_JUMPTABLE_00 =
         (code *)CONCAT71((int7)((ulong)UNRECOVERED_JUMPTABLE_00 >> 8),
                          (char)UNRECOVERED_JUMPTABLE_00 + -0x7f);
    goto code_r0x002d50cf;
  }
  do {
    pPVar28 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (pPVar28 <= ctx_00) {
      uVar46 = table->has_bits_offset;
joined_r0x002d0cd3:
      if ((ulong)uVar46 != 0) {
        puVar22 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar46);
        if (((ulong)puVar22 & 3) != 0) {
          AlignFail();
        }
        *puVar22 = *puVar22 | uVar10;
      }
      return (char *)ctx_00;
    }
    bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    aVar37._0_4_ = (uint)bVar1;
    aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
    if ((char)bVar1 < '\0') {
      uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar13 = CONCAT71(uVar36,*(char *)aVar29);
      if (*(char *)aVar29 < '\0') {
        uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
        cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
        lVar13 = CONCAT71(uVar36,cVar2);
        if (cVar2 < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
          lVar13 = CONCAT71(uVar36,cVar2);
          if (cVar2 < '\0') {
            uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar13 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
            if (cVar2 < '\0') {
              aVar37._0_4_ = 0;
              aVar29.data = 0;
            }
            else {
              aVar37._0_4_ = (int)CONCAT71(uVar36,cVar2) << 0x1c | (uint)(uVar36 >> 0x1c);
              aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
            }
          }
          else {
            aVar37._0_4_ = (int)lVar13 << 0x15 | (uint)(uVar36 >> 0x23);
            aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
          }
        }
        else {
          aVar37._0_4_ = (int)lVar13 << 0xe | (uint)(uVar36 >> 0x2a);
          aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
        }
      }
      else {
        aVar37._0_4_ = (int)lVar13 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
      }
    }
    if (aVar37._0_4_ != uVar34) {
      if (ctx_00 < pPVar28) {
        uVar46 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
        uVar10 = (uint)table->fast_idx_mask & (uint)uVar46;
        if ((uVar10 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar23 = (ulong)(uVar10 & 0xfffffff8);
        pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar23))
                                    (msg,ctx_00,ctx,
                                     (ulong)uVar46 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar23 * 2),table,hasbits)
        ;
        return pcVar12;
      }
      uVar46 = table->has_bits_offset;
      goto joined_r0x002d0cd3;
    }
LAB_002d089b:
    pcVar12._2_6_ = 0;
    pcVar12._0_2_ = *(ushort *)(aVar50.data + 0xc);
    aVar21.data = (uint64_t)UntypedMapBase::AllocNode(aVar50.data,(size_t)pcVar12);
    uVar46 = *(ushort *)(aVar50.data + 0xc);
    uVar23 = (ulong)uVar46 - 8;
    if (uVar23 < 8) {
      pcVar12 = (char *)0x8;
      failure_msg = (int *)absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                                     (uVar23,8,
                                      "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
      ;
    }
    else {
      failure_msg = (int *)0x0;
    }
    if (failure_msg != (int *)0x0) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      aVar33.data = (uint64_t)&aStack_80;
      iVar9 = 0xb2c;
      goto LAB_002d0d60;
    }
    *(char **)(aVar21.data + 8) = (char *)0x0;
    *(undefined8 *)((long)(aVar21.data - 8) + (ulong)uVar46) = 0;
    aVar33.data = (uint64_t)&aStack_48;
    f_01.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
              *)aVar33.data;
    f_01.this = (UntypedMapBase *)aVar50.data;
    f_01.node = (NodeBase **)&aStack_60;
    aStack_80 = aVar50;
    aStack_78.data = aVar33.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar21;
    aStack_48 = aVar50;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar50,f_01);
    aStack_40.data = (uint64_t)&aStack_88;
    f_02.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)aVar33.data;
    f_02.this = (UntypedMapBase *)aVar50.data;
    f_02.node = (NodeBase **)&aStack_60;
    aVar40 = aVar50;
    wire_bytes._M_len = aVar50;
    aStack_80 = aVar50;
    aStack_78.data = aVar33.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar21;
    aStack_48 = aVar50;
    aStack_38 = aVar50;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar50,f_02);
    bVar1 = *(byte *)aVar29;
    aVar38.data._1_7_ = 0;
    aVar38.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      pcVar12._4_4_ = 0;
      pcVar12._0_4_ = CONCAT31(0,bVar1);
      pVar59 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
      aVar38.data = pVar59._8_8_ & 0xffffffff;
    }
    else {
      pVar59._8_8_ = extraout_RDX_14;
      pVar59.first = (char *)(aVar29.data + 1);
      aVar29 = aVar40;
    }
    pPVar28 = pVar59._8_8_;
    aVar40.data = (uint64_t)pVar59.first;
    if (((EpsCopyInputStream *)aVar40.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
      aVar40.data = 0;
    }
    else {
      aVar29.data = (uint64_t)&aStack_80;
      pcVar12 = (char *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar29,(char *)ctx,(int)pVar59.first);
      auStack_68._4_4_ = aStack_80.data._0_4_;
      ctx->depth_ = ctx->depth_ + -1;
      pPVar28 = extraout_RDX_15;
    }
    if ((EpsCopyInputStream *)aVar40.data == (EpsCopyInputStream *)0x0) {
LAB_002d0a13:
      ctx_00 = (ParseContext *)0x0;
    }
    else {
      iVar9 = ctx->depth_;
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar9;
      aVar38 = aStack_88;
      aVar29 = aVar21;
      aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      wire_bytes._M_len = aVar50;
      ctx_00 = (ParseContext *)
               ParseOneMapEntry((NodeBase *)aVar21,(char *)aVar40,ctx,(FieldAux *)aStack_88,table,
                                (FieldEntry *)aStack_50,(UntypedMapBase *)aVar50);
      pPVar28 = extraout_RDX_16;
      if (ctx_00 != (ParseContext *)0x0) {
        aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        if (iVar9 == ctx->depth_) {
          failure_msg = (int *)0x0;
        }
        else {
          aVar29 = aVar33;
          failure_msg = (int *)absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                         (aVar33.data,aVar40.data,"old_depth == depth_");
          pPVar28 = extraout_RDX_17;
        }
        if (failure_msg != (int *)0x0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          aVar33.data = (uint64_t)&aStack_80;
          goto switchD_002cf07a_caseD_9;
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      aVar37._0_4_ = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
      (ctx->super_EpsCopyInputStream).limit_ = aVar37._0_4_;
      pcVar12 = (char *)aVar40;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_002d0a13;
      aVar38._0_4_ = (int)aVar37._0_4_ >> 0x1f & aVar37._0_4_;
      aVar38.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar38._0_4_;
    }
    if (ctx_00 == (ParseContext *)0x0) {
      if (*(long *)(aVar50.data + 0x18) == 0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)aVar50,(NodeBase *)aVar21);
        pPVar28 = extraout_RDX_18;
        pcVar12 = (char *)aVar21;
      }
      pcVar12 = Error(msg,pcVar12,pPVar28,(TcFieldData)aVar38,table,hasbits);
      return pcVar12;
    }
    if ((bStack_a9 & 0x10) == 0) break;
    puVar22 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar50,(NodeBase *)aVar21);
    aVar37._0_4_ = *puVar22;
    puVar22 = *(uint **)(aStack_88.data + 8);
    pcVar12 = (char *)(long)(short)*puVar22;
    aVar29.data._0_4_ = *puVar22 >> 0x10;
    aVar29.data._4_4_ = 0;
    pPVar28 = (ParseContext *)(((long)(int)aVar37._0_4_ - (long)pcVar12) - (long)aVar29);
    if ((EpsCopyInputStream *)((long)(int)aVar37._0_4_ - (long)pcVar12) < aVar29.data) break;
    uVar24 = puVar22[1];
    pcVar12._4_4_ = 0;
    pcVar12._0_4_ = uVar24;
    aVar29.data._2_6_ = 0;
    aVar29.data._0_2_ = (ushort)uVar24;
    if (pPVar28 < (ulong)aVar29) {
      aVar29.data._1_1_ = (char)(uVar24 >> 8);
      aVar29.data._0_1_ = (puVar22[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0;
      aVar29.data._2_6_ = 0;
    }
    else {
      pPVar28 = (ParseContext *)(ulong)(uVar24 >> 0x10);
      aVar40.data = 0;
      while (pcVar12 = (char *)aVar40, aVar29._1_7_ = (undefined7)((ulong)aVar29 >> 8),
            aVar29.data._0_1_ = pcVar12 < pPVar28, pcVar12 < pPVar28) {
        uVar45 = *(uint *)((long)puVar22 + (long)pcVar12 * 4 + (ulong)(uVar24 >> 3 & 0x1ffc) + 8);
        aVar29.data._4_4_ = 0;
        aVar29.data._0_4_ = uVar45;
        aVar43.data = ((long)pcVar12 * 2 - (ulong)((int)aVar37._0_4_ < (int)uVar45)) + 2;
        aVar40.data = aVar43.data;
        if (uVar45 == aVar37._0_4_) goto LAB_002d0a57;
      }
    }
    if ((char)aVar29.data != '\0') break;
    WriteMapEntryAsUnknown
              (msg,table,(UntypedMapBase *)aVar50,uVar34,(NodeBase *)aVar21,SUB85(aStack_58.data,0))
    ;
    aVar43 = aVar21;
  } while( true );
LAB_002d0a57:
  pcVar18 = (char *)(ulong)(*(uint *)(aVar50.data + 0xc) >> 0x18);
  if (5 < ((byte)(*(uint *)(aVar50.data + 0xc) >> 0x18) & 0xf)) {
switchD_002d0a7d_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x002d0a6c;
switchD_002d0a7d_caseD_9:
  pcVar12 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                      ((MessageLite *)aVar29,pcVar12,pPVar28,(TcFieldData)puVar22,
                       (TcParseTableBase *)aVar43,aVar33.data);
  return pcVar12;
switchD_002cf07a_caseD_9:
  iVar9 = 0x481;
LAB_002d0d60:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aVar33,pcVar12,iVar9,(Nonnull<const_char_*>)failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aVar33);
}

Assistant:

const char* TcParser::FastEndGroupImpl(PROTOBUF_TC_PARAM_DECL) {
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  ctx->SetLastTag(data.decoded_tag());
  ptr += sizeof(TagType);
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}